

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

void __thiscall IGameController::EvaluateSpawnType(IGameController *this,CSpawnEval *pEval,int Type)

{
  vec2 *pvVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  vec2 Pos;
  float fVar14;
  CCharacter *aEnts [64];
  float local_268 [12];
  CEntity *local_238 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < this->m_aNumSpawnPoints[Type]) {
    lVar6 = 0;
    do {
      pvVar1 = this->m_aaSpawnPoints[Type] + lVar6;
      uVar4 = CGameWorld::FindEntities(&this->m_pGameServer->m_World,*pvVar1,64.0,local_238,0x40,3);
      local_268[0] = 0.0;
      local_268[1] = 0.0;
      local_268[2] = -32.0;
      local_268[3] = 0.0;
      local_268[4] = 0.0;
      local_268[5] = -32.0;
      local_268[6] = 32.0;
      local_268[7] = 0.0;
      local_268[8] = 0.0;
      local_268[9] = 32.0;
      uVar8 = 0;
      do {
        if (0 < (int)uVar4) {
          fVar13 = local_268[uVar8 * 2];
          fVar2 = local_268[uVar8 * 2 + 1];
          uVar7 = 0;
          do {
            fVar12 = (pvVar1->field_0).x + fVar13;
            fVar14 = (pvVar1->field_1).y + fVar2;
            uVar10 = -(uint)(0.0 < fVar12);
            uVar11 = -(uint)(0.0 < fVar14);
            bVar3 = CCollision::IsTile(&this->m_pGameServer->m_Collision,
                                       (int)((float)(~uVar10 & 0xbf000000 | uVar10 & 0x3f000000) +
                                            fVar12),
                                       (int)((float)(~uVar11 & 0xbf000000 | uVar11 & 0x3f000000) +
                                            fVar14),1);
            iVar9 = -1;
            if (bVar3) goto LAB_00121c21;
            fVar12 = (local_238[uVar7]->m_Pos).field_0.x - ((pvVar1->field_0).x + fVar13);
            fVar14 = (local_238[uVar7]->m_Pos).field_1.y - ((pvVar1->field_1).y + fVar2);
            fVar12 = fVar12 * fVar12 + fVar14 * fVar14;
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            if (fVar12 <= local_238[uVar7]->m_ProximityRadius) goto LAB_00121c21;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        iVar9 = (int)uVar8;
LAB_00121c21:
      } while ((uVar8 < 4) && (uVar8 = uVar8 + 1, iVar9 == -1));
      if (iVar9 != -1) {
        Pos.field_0.x = (float)*(undefined8 *)(local_268 + (long)iVar9 * 2) + (*pvVar1).field_0.x;
        Pos.field_1.y =
             (float)((ulong)*(undefined8 *)(local_268 + (long)iVar9 * 2) >> 0x20) +
             (*pvVar1).field_1.y;
        if (pEval->m_RandomSpawn == true) {
          iVar5 = rand();
          fVar13 = (float)iVar5 * 4.656613e-10 + (float)iVar9;
        }
        else {
          fVar13 = EvaluateSpawnPos(this,pEval,Pos);
        }
        if ((pEval->m_Got != true) || (fVar13 < pEval->m_Score)) {
          pEval->m_Got = true;
          pEval->m_Score = fVar13;
          pEval->m_Pos = Pos;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->m_aNumSpawnPoints[Type]);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::EvaluateSpawnType(CSpawnEval *pEval, int Type) const
{
	// get spawn point
	for(int i = 0; i < m_aNumSpawnPoints[Type]; i++)
	{
		// check if the position is occupado
		CCharacter *aEnts[MAX_CLIENTS];
		int Num = GameServer()->m_World.FindEntities(m_aaSpawnPoints[Type][i], 64, (CEntity**)aEnts, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
		vec2 Positions[5] = { vec2(0.0f, 0.0f), vec2(-32.0f, 0.0f), vec2(0.0f, -32.0f), vec2(32.0f, 0.0f), vec2(0.0f, 32.0f) };	// start, left, up, right, down
		int Result = -1;
		for(int Index = 0; Index < 5 && Result == -1; ++Index)
		{
			Result = Index;
			for(int c = 0; c < Num; ++c)
				if(GameServer()->Collision()->CheckPoint(m_aaSpawnPoints[Type][i]+Positions[Index]) ||
					distance(aEnts[c]->GetPos(), m_aaSpawnPoints[Type][i]+Positions[Index]) <= aEnts[c]->GetProximityRadius())
				{
					Result = -1;
					break;
				}
		}
		if(Result == -1)
			continue;	// try next spawn point

		vec2 P = m_aaSpawnPoints[Type][i]+Positions[Result];
		float S = pEval->m_RandomSpawn ? (Result + random_float()) : EvaluateSpawnPos(pEval, P);
		if(!pEval->m_Got || pEval->m_Score > S)
		{
			pEval->m_Got = true;
			pEval->m_Score = S;
			pEval->m_Pos = P;
		}
	}
}